

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_save(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  char *local_60;
  FString local_28;
  FString fname;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  fname.Chars._4_4_ = key;
  iVar1 = FCommandLine::argc(argv);
  if ((1 < iVar1) && (iVar1 = FCommandLine::argc(argv), iVar1 < 4)) {
    pcVar2 = FCommandLine::operator[](argv,1);
    FString::FString(&local_28,pcVar2);
    DefaultExtension(&local_28,".zds");
    pcVar2 = FString::operator_cast_to_char_(&local_28);
    iVar1 = FCommandLine::argc(argv);
    if (iVar1 < 3) {
      local_60 = FCommandLine::operator[](argv,1);
    }
    else {
      local_60 = FCommandLine::operator[](argv,2);
    }
    G_SaveGame(pcVar2,local_60);
    FString::~FString(&local_28);
    return;
  }
  Printf("usage: save <filename> [description]\n");
  return;
}

Assistant:

CCMD (save)
{
    if (argv.argc() < 2 || argv.argc() > 3)
	{
        Printf ("usage: save <filename> [description]\n");
        return;
    }
    FString fname = argv[1];
	DefaultExtension (fname, "." SAVEGAME_EXT);
	G_SaveGame (fname, argv.argc() > 2 ? argv[2] : argv[1]);
}